

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

void fix_diff_subtract(saucy *s,int cf,int *a,int *b)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = (s->right).clen[cf];
  iVar4 = cf + iVar1;
  if (-1 < iVar1) {
    iVar2 = iVar4;
    if (iVar4 < cf) {
      iVar2 = cf;
    }
    lVar3 = 0;
    do {
      s->stuff[a[cf + lVar3]] = '\x01';
      lVar3 = lVar3 + 1;
    } while ((iVar2 - cf) + 1 != (int)lVar3);
  }
  if (-1 < iVar1) {
    iVar2 = iVar4;
    if (iVar4 < cf) {
      iVar2 = cf;
    }
    lVar3 = 0;
    do {
      if (s->stuff[b[cf + lVar3]] == '\0') {
        add_diff(s,b[cf + lVar3]);
      }
      lVar3 = lVar3 + 1;
    } while ((iVar2 - cf) + 1 != (int)lVar3);
  }
  if (-1 < iVar1) {
    if (iVar4 < cf) {
      iVar4 = cf;
    }
    lVar3 = 0;
    do {
      s->stuff[a[cf + lVar3]] = '\0';
      lVar3 = lVar3 + 1;
    } while ((iVar4 - cf) + 1 != (int)lVar3);
  }
  return;
}

Assistant:

static void
fix_diff_subtract(struct saucy *s, int cf, const int *a, const int *b)
{
    int i, k;
    int cb = cf + s->right.clen[cf];

    /* Mark the contents of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 1;
    }

    /* Add elements from second set not present in the first */
    for (i = cf; i <= cb; ++i) {
        k = b[i];
        if (!s->stuff[k]) add_diff(s, k);
    }

    /* Clear the marks of the first set */
    for (i = cf; i <= cb; ++i) {
        s->stuff[a[i]] = 0;
    }
}